

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall glslang::TQualifier::makeTemporary(TQualifier *this)

{
  TQualifier *this_local;
  
  this->semanticName = (char *)0x0;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xffffffffffffff80;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xffffffffffff007f;
  clearInterstage(this);
  clearMemory(this);
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xfffffffeffffffff;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xfffffffdffffffff;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xfbffffffffffffff;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xfffffff7ffffffff;
  clearLayout(this);
  this->spirvStorageClass = -1;
  this->spirvDecorate = (TSpirvDecorate *)0x0;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xf7ffffffffffffff;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xefffffffffffffff;
  return;
}

Assistant:

void makeTemporary()
    {
        semanticName = nullptr;
        storage = EvqTemporary;
        builtIn = EbvNone;
        clearInterstage();
        clearMemory();
        specConstant = false;
        nonUniform = false;
        nullInit = false;
        defaultBlock = false;
        clearLayout();
        spirvStorageClass = -1;
        spirvDecorate = nullptr;
        spirvByReference = false;
        spirvLiteral = false;
    }